

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageDeleteAll(Fts5Storage *p)

{
  int iVar1;
  long *in_RDI;
  int rc;
  Fts5Config *pConfig;
  Fts5Index *p_00;
  sqlite3_value *in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe8;
  Fts5Storage *p_01;
  
  p_01 = (Fts5Storage *)*in_RDI;
  *(undefined4 *)(in_RDI + 2) = 0;
  p_00 = (Fts5Index *)p_01->nTotalRow;
  iVar1 = fts5ExecPrintf((sqlite3 *)p_01->pConfig,(char **)0x0,
                         "DELETE FROM %Q.\'%q_data\';DELETE FROM %Q.\'%q_idx\';",
                         *(undefined8 *)&p_01->bTotalsValid,p_01->nTotalRow,
                         *(undefined8 *)&p_01->bTotalsValid);
  if ((iVar1 == 0) && (*(int *)(p_01->aStmt + 7) != 0)) {
    iVar1 = fts5ExecPrintf((sqlite3 *)p_01->pConfig,(char **)0x0,"DELETE FROM %Q.\'%q_docsize\';",
                           *(undefined8 *)&p_01->bTotalsValid,p_01->nTotalRow);
  }
  if ((iVar1 == 0) && (*(int *)(p_01->aStmt + 3) == 3)) {
    iVar1 = fts5ExecPrintf((sqlite3 *)p_01->pConfig,(char **)0x0,"DELETE FROM %Q.\'%q_content\';",
                           *(undefined8 *)&p_01->bTotalsValid,p_01->nTotalRow);
  }
  if (iVar1 == 0) {
    iVar1 = sqlite3Fts5IndexReinit(p_00);
  }
  if (iVar1 == 0) {
    iVar1 = sqlite3Fts5StorageConfigValue
                      (p_01,(char *)(ulong)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                       (int)((ulong)p_00 >> 0x20));
  }
  return iVar1;
}

Assistant:

static int sqlite3Fts5StorageDeleteAll(Fts5Storage *p){
  Fts5Config *pConfig = p->pConfig;
  int rc;

  p->bTotalsValid = 0;

  /* Delete the contents of the %_data and %_docsize tables. */
  rc = fts5ExecPrintf(pConfig->db, 0,
      "DELETE FROM %Q.'%q_data';"
      "DELETE FROM %Q.'%q_idx';",
      pConfig->zDb, pConfig->zName,
      pConfig->zDb, pConfig->zName
  );
  if( rc==SQLITE_OK && pConfig->bColumnsize ){
    rc = fts5ExecPrintf(pConfig->db, 0,
        "DELETE FROM %Q.'%q_docsize';", pConfig->zDb, pConfig->zName
    );
  }

  if( rc==SQLITE_OK && pConfig->eContent==FTS5_CONTENT_UNINDEXED ){
    rc = fts5ExecPrintf(pConfig->db, 0,
        "DELETE FROM %Q.'%q_content';", pConfig->zDb, pConfig->zName
    );
  }

  /* Reinitialize the %_data table. This call creates the initial structure
  ** and averages records.  */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexReinit(p->pIndex);
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5StorageConfigValue(p, "version", 0, FTS5_CURRENT_VERSION);
  }
  return rc;
}